

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_buf.c
# Opt level: O0

GCstr * lj_buf_cat2str(lua_State *L,GCstr *s1,GCstr *s2)

{
  uint uVar1;
  uint uVar2;
  char *str;
  GCstr *pGVar3;
  char *buf;
  MSize len2;
  MSize len1;
  GCstr *s2_local;
  GCstr *s1_local;
  lua_State *L_local;
  
  uVar1 = s1->len;
  uVar2 = s2->len;
  str = lj_buf_tmp(L,uVar1 + uVar2);
  memcpy(str,s1 + 1,(ulong)uVar1);
  memcpy(str + uVar1,s2 + 1,(ulong)uVar2);
  pGVar3 = lj_str_new(L,str,(ulong)(uVar1 + uVar2));
  return pGVar3;
}

Assistant:

GCstr *lj_buf_cat2str(lua_State *L, GCstr *s1, GCstr *s2)
{
  MSize len1 = s1->len, len2 = s2->len;
  char *buf = lj_buf_tmp(L, len1 + len2);
  memcpy(buf, strdata(s1), len1);
  memcpy(buf+len1, strdata(s2), len2);
  return lj_str_new(L, buf, len1 + len2);
}